

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * MyGame_Example_Any_parse_json_union
                 (flatcc_json_parser_t *ctx,char *buf,char *end,uint8_t type,
                 flatcc_builder_ref_t *result)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  flatcc_builder_ref_t fVar4;
  size_t n;
  char *pcVar5;
  ulong uVar6;
  ulong *puVar7;
  uint8_t *puVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  flatcc_builder_t *B;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  uint64_t value;
  int more;
  uint8_t local_4d;
  int local_4c;
  uint64_t local_48;
  int local_3c;
  ulong local_38;
  
  *result = 0;
  switch(CONCAT71(in_register_00000009,type) & 0xffffffff) {
  case 0:
    if ((3 < (long)end - (long)buf) && (*(int *)buf == 0x6c6c756e)) {
      return buf + 4;
    }
    iVar3 = 0x1a;
    goto LAB_0011098f;
  case 1:
    buf = MyGame_Example_Monster_parse_json_table(ctx,buf,end,result);
    goto LAB_00110a41;
  case 2:
    *result = 0;
    iVar3 = flatcc_builder_start_table(ctx->ctx,4);
    if (iVar3 == 0) {
      if ((buf == end) || (*buf != '{')) {
        local_3c = 0;
LAB_00110a0e:
        buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
      }
      else {
        puVar15 = (ulong *)(buf + 1);
        if ((long)end - (long)puVar15 < 2) {
LAB_00110a90:
          puVar15 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar15,end);
        }
        else if ((char)(byte)*puVar15 < '!') {
          if (((byte)*puVar15 != 0x20) || (buf[2] < '!')) goto LAB_00110a90;
          puVar15 = (ulong *)(buf + 2);
        }
        if ((puVar15 != (ulong *)end) && ((byte)*puVar15 == 0x7d)) {
          local_3c = 0;
          goto LAB_001113d7;
        }
        local_3c = 1;
        local_38 = 0x636f6c6f72320000;
        do {
          if (puVar15 != (ulong *)end) {
            if ((byte)*puVar15 == 0x2e) {
              puVar15 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar15,end,5);
            }
            else if ((byte)*puVar15 == 0x22) {
              puVar15 = (ulong *)((long)puVar15 + 1);
              ctx->unquoted = 0;
            }
            else {
              ctx->unquoted = 1;
            }
          }
          uVar6 = (long)end - (long)puVar15;
          if (uVar6 < 8) {
            uVar10 = 0;
            uVar9 = 0;
            uVar11 = 0;
            uVar13 = 0;
            uVar14 = 0;
            uVar16 = 0;
            switch(uVar6) {
            case 7:
              uVar10 = (long)(char)*(byte *)((long)puVar15 + 6) << 8;
            case 6:
              uVar9 = (long)(char)*(byte *)((long)puVar15 + 5) << 0x10 | uVar10;
            case 5:
              uVar11 = (long)(char)*(byte *)((long)puVar15 + 4) << 0x18 | uVar9;
            case 4:
              uVar13 = (long)(char)*(byte *)((long)puVar15 + 3) << 0x20 | uVar11;
            case 3:
              uVar14 = (long)(char)*(byte *)((long)puVar15 + 2) << 0x28 | uVar13;
            case 2:
              uVar16 = (long)(char)*(byte *)((long)puVar15 + 1) << 0x30 | uVar14;
            case 1:
              uVar16 = (ulong)(byte)*puVar15 << 0x38 | uVar16;
              goto LAB_00110bb7;
            }
switchD_00110b5d_default:
            buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar15,end);
          }
          else {
            uVar9 = *puVar15;
            uVar16 = (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                     (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                     (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
LAB_00110bb7:
            puVar7 = puVar15;
            if ((uVar16 & 0xffffffffffff0000) == local_38) {
              if (6 < (long)uVar6) {
                bVar1 = *(byte *)((long)puVar15 + 6);
                if (ctx->unquoted == 0) {
                  if (bVar1 == 0x22) {
                    pbVar12 = (byte *)((long)puVar15 + 7);
                    goto LAB_00110c7a;
                  }
                }
                else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                  pbVar12 = (byte *)((long)puVar15 + 6);
                  ctx->unquoted = 0;
LAB_00110c7a:
                  if ((long)end - (long)pbVar12 < 2) {
LAB_00110c98:
                    pbVar12 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar12,end);
                  }
                  else if ((char)*pbVar12 < '!') {
                    if ((*pbVar12 != 0x20) || ((char)pbVar12[1] < '!')) goto LAB_00110c98;
                    pbVar12 = pbVar12 + 1;
                  }
                  if ((pbVar12 == (byte *)end) || (*pbVar12 != 0x3a)) {
                    puVar7 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar12,end,4);
                  }
                  else {
                    puVar7 = (ulong *)(pbVar12 + 1);
                    if ((long)end - (long)puVar7 < 2) {
LAB_00110d94:
                      puVar7 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar7,end);
                    }
                    else if ((char)(byte)*puVar7 < '!') {
                      if (((byte)*puVar7 != 0x20) || ((char)pbVar12[2] < '!')) goto LAB_00110d94;
                      puVar7 = (ulong *)(pbVar12 + 2);
                    }
                  }
                }
              }
              if (puVar15 == puVar7) goto LAB_00110f21;
              local_48 = 0;
              local_4c = 0;
              local_4d = '\0';
              buf = (char *)puVar7;
              if ((puVar7 != (ulong *)end) &&
                 (buf = flatcc_json_parser_integer(ctx,(char *)puVar7,end,&local_4c,&local_48),
                 (ulong *)buf != puVar7)) {
                if (local_4c == 0) {
                  uVar6 = local_48;
                  if (local_48 < 0x80) goto LAB_00110e33;
                  iVar3 = 7;
                }
                else {
                  if (local_48 < 0x81) {
                    uVar6 = -local_48;
LAB_00110e33:
                    local_4d = (uint8_t)uVar6;
                    goto LAB_00110e37;
                  }
                  iVar3 = 8;
                }
                buf = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
              }
LAB_00110e37:
              if ((puVar7 == (ulong *)buf) &&
                 ((buf = flatcc_json_parser_symbolic_int8
                                   (ctx,buf,end,
                                    (flatcc_json_parser_integral_symbol_f **)
                                    MyGame_Example_TestSimpleTableWithEnum_parse_json_table_symbolic_parsers
                                    ,(int8_t *)&local_4d), (ulong *)buf == puVar7 || (buf == end))))
              goto LAB_00110a2b;
              if ((local_4d == '\x02') && ((ctx->flags & 2) == 0)) goto LAB_0011138b;
              B = ctx->ctx;
              iVar3 = 1;
LAB_00111375:
              uVar2 = local_4d;
              puVar8 = (uint8_t *)flatcc_builder_table_add(B,iVar3,1,1);
              if (puVar8 == (uint8_t *)0x0) goto LAB_00110a2b;
              *puVar8 = uVar2;
            }
            else {
              if ((uVar16 & 0xffffffffff000000) == 0x636f6c6f72000000) {
                if (5 < (long)uVar6) {
                  bVar1 = *(byte *)((long)puVar15 + 5);
                  if (ctx->unquoted == 0) {
                    if (bVar1 == 0x22) {
                      pbVar12 = (byte *)((long)puVar15 + 6);
                      goto LAB_00110d0f;
                    }
                  }
                  else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                    pbVar12 = (byte *)((long)puVar15 + 5);
                    ctx->unquoted = 0;
LAB_00110d0f:
                    if ((long)end - (long)pbVar12 < 2) {
LAB_00110d2d:
                      pbVar12 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar12,end);
                    }
                    else if ((char)*pbVar12 < '!') {
                      if ((*pbVar12 != 0x20) || ((char)pbVar12[1] < '!')) goto LAB_00110d2d;
                      pbVar12 = pbVar12 + 1;
                    }
                    if ((pbVar12 == (byte *)end) || (*pbVar12 != 0x3a)) {
                      puVar7 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar12,end,4);
                    }
                    else {
                      puVar7 = (ulong *)(pbVar12 + 1);
                      if ((long)end - (long)puVar7 < 2) {
LAB_00110e93:
                        puVar7 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar7,end);
                      }
                      else if ((char)(byte)*puVar7 < '!') {
                        if (((byte)*puVar7 != 0x20) || ((char)pbVar12[2] < '!')) goto LAB_00110e93;
                        puVar7 = (ulong *)(pbVar12 + 2);
                      }
                    }
                  }
                }
                if (puVar15 != puVar7) {
                  local_48 = 0;
                  local_4c = 0;
                  local_4d = '\0';
                  buf = (char *)puVar7;
                  if ((puVar7 != (ulong *)end) &&
                     (buf = flatcc_json_parser_integer(ctx,(char *)puVar7,end,&local_4c,&local_48),
                     (ulong *)buf != puVar7)) {
                    if (local_4c == 0) {
                      uVar6 = local_48;
                      if (local_48 < 0x80) goto LAB_00111129;
                      iVar3 = 7;
                    }
                    else {
                      if (local_48 < 0x81) {
                        uVar6 = -local_48;
LAB_00111129:
                        local_4d = (uint8_t)uVar6;
                        goto LAB_0011112d;
                      }
                      iVar3 = 8;
                    }
                    buf = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
                  }
LAB_0011112d:
                  if ((puVar7 != (ulong *)buf) ||
                     ((buf = flatcc_json_parser_symbolic_int8
                                       (ctx,buf,end,
                                        (flatcc_json_parser_integral_symbol_f **)
                                        MyGame_Example_TestSimpleTableWithEnum_parse_json_table_symbolic_parsers_213
                                        ,(int8_t *)&local_4d), (ulong *)buf != puVar7 &&
                      (buf != end)))) {
                    if ((local_4d != '\x02') || ((ctx->flags & 2) != 0)) {
                      B = ctx->ctx;
                      iVar3 = 0;
                      goto LAB_00111375;
                    }
                    goto LAB_0011138b;
                  }
                  goto LAB_00110a2b;
                }
              }
LAB_00110f21:
              puVar15 = puVar7;
              if ((uint)(uVar16 >> 0x28) == 0x756332) {
                if (3 < (long)end - (long)puVar7) {
                  bVar1 = *(byte *)((long)puVar7 + 3);
                  if (ctx->unquoted == 0) {
                    if (bVar1 == 0x22) {
                      pbVar12 = (byte *)((long)puVar7 + 4);
                      goto LAB_00110fe8;
                    }
                  }
                  else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                    pbVar12 = (byte *)((long)puVar7 + 3);
                    ctx->unquoted = 0;
LAB_00110fe8:
                    if ((long)end - (long)pbVar12 < 2) {
LAB_00111006:
                      pbVar12 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar12,end);
                    }
                    else if ((char)*pbVar12 < '!') {
                      if ((*pbVar12 != 0x20) || ((char)pbVar12[1] < '!')) goto LAB_00111006;
                      pbVar12 = pbVar12 + 1;
                    }
                    if ((pbVar12 == (byte *)end) || (*pbVar12 != 0x3a)) {
                      puVar15 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar12,end,4);
                    }
                    else {
                      puVar15 = (ulong *)(pbVar12 + 1);
                      if ((long)end - (long)puVar15 < 2) {
LAB_00111186:
                        puVar15 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar15,end);
                      }
                      else if ((char)(byte)*puVar15 < '!') {
                        if (((byte)*puVar15 != 0x20) || ((char)pbVar12[2] < '!')) goto LAB_00111186;
                        puVar15 = (ulong *)(pbVar12 + 2);
                      }
                    }
                  }
                }
                if (puVar7 == puVar15) goto switchD_00110b5d_default;
                local_48 = 0;
                local_4c = 0;
                local_4d = '\0';
                buf = (char *)puVar15;
                if ((puVar15 != (ulong *)end) &&
                   (buf = flatcc_json_parser_integer(ctx,(char *)puVar15,end,&local_4c,&local_48),
                   (ulong *)buf != puVar15)) {
                  if (local_4c == 0) {
                    if (local_48 < 0x100) {
                      local_4d = (uint8_t)local_48;
                      goto LAB_00111218;
                    }
                    iVar3 = 7;
                  }
                  else {
                    iVar3 = 8;
                  }
                  buf = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
                }
LAB_00111218:
                if ((puVar15 == (ulong *)buf) &&
                   ((buf = flatcc_json_parser_symbolic_uint8
                                     (ctx,buf,end,
                                      (flatcc_json_parser_integral_symbol_f **)
                                      MyGame_Example_TestSimpleTableWithEnum_parse_json_table_symbolic_parsers_214
                                      ,&local_4d), (ulong *)buf == puVar15 || (buf == end))))
                goto LAB_00110a2b;
                if ((local_4d != '\x02') || ((ctx->flags & 2) != 0)) {
                  B = ctx->ctx;
                  iVar3 = 3;
                  goto LAB_00111375;
                }
              }
              else {
                if ((short)(uVar16 >> 0x30) != 0x7563) goto switchD_00110b5d_default;
                if (2 < (long)end - (long)puVar7) {
                  bVar1 = *(byte *)((long)puVar7 + 2);
                  if (ctx->unquoted == 0) {
                    if (bVar1 == 0x22) {
                      pbVar12 = (byte *)((long)puVar7 + 3);
                      goto LAB_0011107d;
                    }
                  }
                  else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                    pbVar12 = (byte *)((long)puVar7 + 2);
                    ctx->unquoted = 0;
LAB_0011107d:
                    if ((long)end - (long)pbVar12 < 2) {
LAB_001110bf:
                      pbVar12 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar12,end);
                    }
                    else if ((char)*pbVar12 < '!') {
                      if ((*pbVar12 != 0x20) || ((char)pbVar12[1] < '!')) goto LAB_001110bf;
                      pbVar12 = pbVar12 + 1;
                    }
                    if ((pbVar12 == (byte *)end) || (*pbVar12 != 0x3a)) {
                      puVar15 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar12,end,4);
                    }
                    else {
                      puVar15 = (ulong *)(pbVar12 + 1);
                      if ((long)end - (long)puVar15 < 2) {
LAB_0011127a:
                        puVar15 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar15,end);
                      }
                      else if ((char)(byte)*puVar15 < '!') {
                        if (((byte)*puVar15 != 0x20) || ((char)pbVar12[2] < '!')) goto LAB_0011127a;
                        puVar15 = (ulong *)(pbVar12 + 2);
                      }
                    }
                  }
                }
                if (puVar7 == puVar15) goto switchD_00110b5d_default;
                local_48 = 0;
                local_4c = 0;
                local_4d = '\0';
                buf = (char *)puVar15;
                if ((puVar15 != (ulong *)end) &&
                   (buf = flatcc_json_parser_integer(ctx,(char *)puVar15,end,&local_4c,&local_48),
                   (ulong *)buf != puVar15)) {
                  if (local_4c == 0) {
                    if (local_48 < 0x100) {
                      local_4d = (uint8_t)local_48;
                      goto LAB_00111322;
                    }
                    iVar3 = 7;
                  }
                  else {
                    iVar3 = 8;
                  }
                  buf = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
                }
LAB_00111322:
                if ((puVar15 == (ulong *)buf) &&
                   ((buf = flatcc_json_parser_symbolic_uint8
                                     (ctx,buf,end,
                                      (flatcc_json_parser_integral_symbol_f **)
                                      MyGame_Example_TestSimpleTableWithEnum_parse_json_table_symbolic_parsers_215
                                      ,&local_4d), (ulong *)buf == puVar15 || (buf == end))))
                goto LAB_00110a2b;
                if ((local_4d != '\x02') || ((ctx->flags & 2) != 0)) {
                  B = ctx->ctx;
                  iVar3 = 2;
                  goto LAB_00111375;
                }
              }
            }
          }
LAB_0011138b:
          puVar15 = (ulong *)flatcc_json_parser_object_end(ctx,buf,end,&local_3c);
          buf = (char *)puVar15;
        } while (local_3c != 0);
      }
      goto LAB_00110a24;
    }
    break;
  case 3:
    *result = 0;
    iVar3 = flatcc_builder_start_table(ctx->ctx,0);
    if (iVar3 == 0) {
      if ((buf == end) || (*buf != '{')) goto LAB_00110a0e;
      puVar15 = (ulong *)(buf + 1);
      if ((long)end - (long)puVar15 < 2) {
LAB_001113ba:
        puVar15 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar15,end);
      }
      else if ((char)(byte)*puVar15 < '!') {
        if (((byte)*puVar15 != 0x20) || (buf[2] < '!')) goto LAB_001113ba;
        puVar15 = (ulong *)(buf + 2);
      }
      if ((puVar15 == (ulong *)end) || ((byte)*puVar15 != 0x7d)) {
        local_48 = CONCAT44(local_48._4_4_,1);
        do {
          if (puVar15 != (ulong *)end) {
            if ((byte)*puVar15 == 0x2e) {
              puVar15 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar15,end,5);
            }
            else if ((byte)*puVar15 == 0x22) {
              puVar15 = (ulong *)((long)puVar15 + 1);
              ctx->unquoted = 0;
            }
            else {
              ctx->unquoted = 1;
            }
          }
          pcVar5 = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar15,end);
          puVar15 = (ulong *)flatcc_json_parser_object_end(ctx,pcVar5,end,(int *)&local_48);
          buf = (char *)puVar15;
        } while ((int)local_48 != 0);
        goto LAB_00110a24;
      }
LAB_001113d7:
      buf = (char *)((long)puVar15 + 1);
      if ((long)end - (long)buf < 2) {
LAB_0011148c:
        buf = flatcc_json_parser_space_ext(ctx,buf,end);
      }
      else if (*buf < '!') {
        if ((*buf != 0x20) || ((char)*(byte *)((long)puVar15 + 2) < '!')) goto LAB_0011148c;
        buf = (char *)((long)puVar15 + 2);
      }
LAB_00110a24:
      if (ctx->error == 0) {
        fVar4 = flatcc_builder_end_table(ctx->ctx);
        *result = fVar4;
        if (fVar4 != 0) goto LAB_00110a41;
      }
    }
    break;
  case 4:
    buf = MyGame_Example_Alt_parse_json_table(ctx,buf,end,result);
    goto LAB_00110a41;
  default:
    if ((ctx->flags & 1) != 0) {
      pcVar5 = flatcc_json_parser_generic_json(ctx,buf,end);
      return pcVar5;
    }
    iVar3 = 0xf;
LAB_0011098f:
    pcVar5 = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
    return pcVar5;
  }
LAB_00110a2b:
  buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
LAB_00110a41:
  if ((ctx->error == 0) && (*result == 0)) {
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  }
  return (char *)(ulong *)buf;
}

Assistant:

static const char *MyGame_Example_Any_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *result)
{

    *result = 0;
    switch (type) {
    case 0: /* NONE */
        return flatcc_json_parser_none(ctx, buf, end);
    case 1: /* Monster */
        buf = MyGame_Example_Monster_parse_json_table(ctx, buf, end, result);
        break;
    case 2: /* TestSimpleTableWithEnum */
        buf = MyGame_Example_TestSimpleTableWithEnum_parse_json_table(ctx, buf, end, result);
        break;
    case 3: /* Monster2 */
        buf = MyGame_Example2_Monster_parse_json_table(ctx, buf, end, result);
        break;
    case 4: /* Alt */
        buf = MyGame_Example_Alt_parse_json_table(ctx, buf, end, result);
        break;
    default:
        if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);
        } else {
            return flatcc_json_parser_generic_json(ctx, buf, end);
        }
    }
    if (ctx->error) return buf;
    if (!*result) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
    }
    return buf;
}